

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_assign.h
# Opt level: O1

void dlib::blas_bindings::
     matrix_assign_blas_helper<dlib::assignable_ptr_matrix<float>,dlib::matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>,void>
     ::
     assign<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
               (assignable_ptr_matrix<float> *dest,
               matrix_multiply_exp<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
               *src,type alpha,bool add_to,bool transpose)

{
  size_t __n;
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  matrix_type temp;
  matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  local_60;
  matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_> local_40;
  matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
  local_38;
  
  if ((alpha != 1.0) || (NAN(alpha))) {
    if (add_to) {
      matrix<float,_0L,_0L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>::
      matrix(&local_60,dest->height,dest->width);
      lVar5 = local_60.data.nc_;
      if (0 < local_60.data.nr_) {
        __n = local_60.data.nc_ * 4;
        lVar6 = local_60.data.nr_;
        pfVar2 = local_60.data.data;
        do {
          if (0 < lVar5) {
            memset(pfVar2,0,__n);
          }
          pfVar2 = pfVar2 + lVar5;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      if (transpose) {
        local_40.op.m = (op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>)src->rhs;
        local_38.op.m =
             (op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
              )src->lhs;
        default_matrix_multiply<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>
                  (&local_60,&local_40,&local_38);
      }
      else {
        default_matrix_multiply<dlib::matrix<float,0l,0l,dlib::memory_manager_stateless_kernel_1<char>,dlib::row_major_layout>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                  (&local_60,src->lhs,src->rhs);
      }
      if ((alpha != -1.0) || (NAN(alpha))) {
        if (0 < local_60.data.nr_) {
          pfVar2 = dest->ptr;
          lVar5 = dest->width;
          lVar6 = 0;
          pfVar1 = local_60.data.data;
          do {
            if (0 < local_60.data.nc_) {
              lVar4 = 0;
              do {
                pfVar2[lVar4] = pfVar1[lVar4] * alpha + pfVar2[lVar4];
                lVar4 = lVar4 + 1;
              } while (local_60.data.nc_ != lVar4);
            }
            lVar6 = lVar6 + 1;
            pfVar2 = pfVar2 + lVar5;
            pfVar1 = pfVar1 + local_60.data.nc_;
          } while (lVar6 != local_60.data.nr_);
        }
      }
      else if (0 < local_60.data.nr_) {
        pfVar2 = dest->ptr;
        lVar5 = dest->width;
        lVar6 = 0;
        pfVar1 = local_60.data.data;
        do {
          if (0 < local_60.data.nc_) {
            lVar4 = 0;
            do {
              pfVar2[lVar4] = pfVar2[lVar4] - pfVar1[lVar4];
              lVar4 = lVar4 + 1;
            } while (local_60.data.nc_ != lVar4);
          }
          lVar6 = lVar6 + 1;
          pfVar2 = pfVar2 + lVar5;
          pfVar1 = pfVar1 + local_60.data.nc_;
        } while (lVar6 != local_60.data.nr_);
      }
      if (local_60.data.data != (float *)0x0) {
        operator_delete__(local_60.data.data);
      }
    }
    else {
      lVar5 = dest->height;
      if (0 < lVar5) {
        pfVar2 = dest->ptr;
        lVar6 = dest->width;
        do {
          if (0 < lVar6) {
            memset(pfVar2,0,lVar6 * 4);
          }
          pfVar2 = pfVar2 + lVar6;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      if (transpose) {
        local_60.data.data = (float *)src->rhs;
        local_40.op.m = (op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>)src->lhs;
        default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>
                  (dest,(matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
                         *)&local_60,
                   (matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                    *)&local_40);
      }
      else {
        default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                  (dest,src->lhs,src->rhs);
      }
      lVar5 = dest->height;
      if (0 < lVar5) {
        pfVar2 = dest->ptr;
        lVar6 = dest->width;
        lVar4 = 0;
        do {
          if (0 < lVar6) {
            lVar3 = 0;
            do {
              pfVar2[lVar3] = pfVar2[lVar3] * alpha;
              lVar3 = lVar3 + 1;
            } while (lVar6 != lVar3);
          }
          lVar4 = lVar4 + 1;
          pfVar2 = pfVar2 + lVar6;
        } while (lVar4 != lVar5);
      }
    }
  }
  else {
    if ((!add_to) && (lVar5 = dest->height, 0 < lVar5)) {
      pfVar2 = dest->ptr;
      lVar6 = dest->width;
      do {
        if (0 < lVar6) {
          memset(pfVar2,0,lVar6 * 4);
        }
        pfVar2 = pfVar2 + lVar6;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    if (!transpose) {
      default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
                (dest,src->lhs,src->rhs);
      return;
    }
    local_60.data.data = (float *)src->rhs;
    local_40.op.m = (op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>)src->lhs;
    default_matrix_multiply<dlib::assignable_ptr_matrix<float>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>,dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>>>>>>>
              (dest,(matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_> *
                    )&local_60,
               (matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_trans<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>_>
                *)&local_40);
  }
  return;
}

Assistant:

static void assign (
                dest_exp& dest,
                const matrix_multiply_exp<EXP1,EXP2>& src,
                typename src_exp::type alpha,
                bool add_to,
                bool transpose
            )
            {
                // At some point I need to improve the default (i.e. non BLAS) matrix 
                // multiplication algorithm...

                if (alpha == static_cast<typename src_exp::type>(1))
                {
                    if (add_to == false)
                    {
                        zero_matrix(dest);
                    }

                    if (transpose == false)
                        default_matrix_multiply(dest, src.lhs, src.rhs);
                    else
                        default_matrix_multiply(dest, trans(src.rhs), trans(src.lhs));
                }
                else
                {
                    if (add_to)
                    {
                        typename dest_exp::matrix_type temp(dest.nr(),dest.nc());
                        zero_matrix(temp);

                        if (transpose == false)
                            default_matrix_multiply(temp, src.lhs, src.rhs);
                        else
                            default_matrix_multiply(temp, trans(src.rhs), trans(src.lhs));

                        matrix_assign_default(dest,temp, alpha,true);
                    }
                    else
                    {
                        zero_matrix(dest);
                        
                        if (transpose == false)
                            default_matrix_multiply(dest, src.lhs, src.rhs);
                        else
                            default_matrix_multiply(dest, trans(src.rhs), trans(src.lhs));

                        matrix_assign_default(dest,dest, alpha, false);
                    }
                }
            }